

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void google::protobuf::compiler::anon_unknown_5::AddDefaultProtoPaths
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *paths)

{
  string_view pc;
  bool bVar1;
  size_type sVar2;
  AlphaNum *pAVar3;
  undefined1 auVar4 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view path_00;
  string_view path_01;
  string_view path_02;
  AlphaNum local_1c8;
  AlphaNum *local_198;
  char *pcStack_190;
  AlphaNum local_188;
  string local_158;
  AlphaNum *local_138;
  char *pcStack_130;
  undefined1 local_128 [16];
  AlphaNum local_118;
  size_t local_e8;
  size_t sStack_e0;
  AlphaNum local_d8;
  undefined1 local_a8 [8];
  string include_path;
  size_t pos;
  string_view path;
  undefined1 local_30 [8];
  string path_str;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *paths_local;
  
  path_str.field_2._8_8_ = paths;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = GetProtocAbsolutePath((string *)local_30);
  if (bVar1) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    path._M_len = auVar4._8_8_;
    pos = auVar4._0_8_;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pos,"/\\",
                       0xffffffffffffffff);
    auVar4._8_8_ = local_128._8_8_;
    auVar4._0_8_ = local_128._0_8_;
    if ((sVar2 != 0xffffffffffffffff) && (local_128 = auVar4, sVar2 != 0)) {
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&pos,0,sVar2);
      path_00._M_str = bVar5._M_str;
      pAVar3 = (AlphaNum *)bVar5._M_len;
      path_00._M_len = (size_t)path_00._M_str;
      include_path.field_2._8_8_ = pAVar3;
      pos = (size_t)pAVar3;
      path._M_len = (size_t)path_00._M_str;
      bVar1 = IsInstalledProtoPath((anon_unknown_5 *)pAVar3,path_00);
      if (bVar1) {
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[1],std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)path_str.field_2._8_8_,(char (*) [1])0x994858,
                   (basic_string_view<char,_std::char_traits<char>_> *)&pos);
      }
      else {
        local_e8 = pos;
        sStack_e0 = path._M_len;
        pc._M_str = (char *)path._M_len;
        pc._M_len = pos;
        absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,pc);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_118,"/include");
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_a8,(lts_20250127 *)&local_d8,&local_118,pAVar3);
        local_128 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a8);
        path_01._M_str = local_128._8_8_;
        path_01._M_len = (size_t)path_01._M_str;
        bVar1 = IsInstalledProtoPath(local_128._0_8_,path_01);
        if (bVar1) {
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<char_const(&)[1],std::__cxx11::string>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)path_str.field_2._8_8_,(char (*) [1])0x994858,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
        }
        else {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)&pos,"/\\",
                             0xffffffffffffffff);
          if ((sVar2 != 0xffffffffffffffff) && (sVar2 != 0)) {
            bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)&pos,0,sVar2);
            pcStack_190 = bVar5._M_str;
            pAVar3 = (AlphaNum *)bVar5._M_len;
            local_198 = pAVar3;
            local_138 = pAVar3;
            pcStack_130 = pcStack_190;
            pos = (size_t)pAVar3;
            path._M_len = (size_t)pcStack_190;
            absl::lts_20250127::AlphaNum::AlphaNum(&local_188,bVar5);
            absl::lts_20250127::AlphaNum::AlphaNum(&local_1c8,"/include");
            absl::lts_20250127::StrCat_abi_cxx11_
                      (&local_158,(lts_20250127 *)&local_188,&local_1c8,pAVar3);
            std::__cxx11::string::operator=((string *)local_a8,(string *)&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a8);
            path_02._M_str = auVar4._8_8_;
            path_02._M_len = (size_t)path_02._M_str;
            bVar1 = IsInstalledProtoPath(auVar4._0_8_,path_02);
            if (bVar1) {
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<char_const(&)[1],std::__cxx11::string>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)path_str.field_2._8_8_,(char (*) [1])0x994858,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
            }
          }
        }
        std::__cxx11::string::~string((string *)local_a8);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void AddDefaultProtoPaths(
    std::vector<std::pair<std::string, std::string>>* paths) {
  // TODO: The code currently only checks relative paths of where
  // the protoc binary is installed. We probably should make it handle more
  // cases than that.
  std::string path_str;
  if (!GetProtocAbsolutePath(&path_str)) {
    return;
  }
  absl::string_view path(path_str);
  // Strip the binary name.
  size_t pos = path.find_last_of("/\\");
  if (pos == path.npos || pos == 0) {
    return;
  }
  path = path.substr(0, pos);
  // Check the binary's directory.
  if (IsInstalledProtoPath(path)) {
    paths->emplace_back("", path);
    return;
  }
  // Check if there is an include subdirectory.
  std::string include_path = absl::StrCat(path, "/include");
  if (IsInstalledProtoPath(include_path)) {
    paths->emplace_back("", std::move(include_path));
    return;
  }
  // Check if the upper level directory has an "include" subdirectory.
  pos = path.find_last_of("/\\");
  if (pos == std::string::npos || pos == 0) {
    return;
  }
  path = path.substr(0, pos);
  include_path = absl::StrCat(path, "/include");
  if (IsInstalledProtoPath(include_path)) {
    paths->emplace_back("", std::move(include_path));
    return;
  }
}